

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x1_010.c
# Opt level: O0

void seta_sound_w(void *chip,UINT16 offset,UINT8 data)

{
  uint uVar1;
  int reg;
  int channel;
  x1_010_state *info;
  UINT8 data_local;
  UINT16 offset_local;
  void *chip_local;
  
  uVar1 = (uint)(offset >> 3);
  if ((((uVar1 < 0x10) && ((offset & 7) == 0)) &&
      ((*(byte *)((long)chip + (ulong)offset + 0x1c) & 1) == 0)) && ((data & 1) != 0)) {
    *(undefined4 *)((long)chip + (long)(int)uVar1 * 4 + 0x201c) = 0;
    *(undefined4 *)((long)chip + (long)(int)uVar1 * 4 + 0x205c) = 0;
  }
  *(UINT8 *)((long)chip + (ulong)offset + 0x1c) = data;
  return;
}

Assistant:

static void seta_sound_w(void *chip, UINT16 offset, UINT8 data)
{
	x1_010_state *info = (x1_010_state *)chip;
	int channel, reg;
	//offset ^= info->adr;

	channel = offset/sizeof(X1_010_CHANNEL);
	reg     = offset%sizeof(X1_010_CHANNEL);

	if( channel < SETA_NUM_CHANNELS && reg == 0
		&& (info->reg[offset]&1) == 0 && (data&1) != 0 ) {
		info->smp_offset[channel] = 0;
		info->env_offset[channel] = 0;
	}
	//LOG_REGISTER_WRITE(("%s: offset %6X : data %2X\n", machine().describe_context(), offset, data ));
	info->reg[offset] = data;
}